

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void quicly__debug_printf(quicly_conn_t *conn,char *function,int line,char *fmt,...)

{
  char *fmt_local;
  int line_local;
  char *function_local;
  quicly_conn_t *conn_local;
  
  return;
}

Assistant:

void quicly__debug_printf(quicly_conn_t *conn, const char *function, int line, const char *fmt, ...)
{
#if QUICLY_USE_EMBEDDED_PROBES || QUICLY_USE_DTRACE
    char buf[1024];
    va_list args;

    if (!QUICLY_DEBUG_MESSAGE_ENABLED())
        return;

    va_start(args, fmt);
    vsnprintf(buf, sizeof(buf), fmt, args);
    va_end(args);

    QUICLY_DEBUG_MESSAGE(conn, function, line, buf);
#endif
}